

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O0

bool __thiscall llvm::DWARFVerifier::handleDebugAbbrev(DWARFVerifier *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DWARFDebugAbbrev *pDVar4;
  StringRef local_40;
  StringRef local_30;
  int local_1c;
  DWARFObject *pDStack_18;
  uint NumErrors;
  DWARFObject *DObj;
  DWARFVerifier *this_local;
  
  DObj = (DWARFObject *)this;
  raw_ostream::operator<<(this->OS,"Verifying .debug_abbrev...\n");
  pDStack_18 = DWARFContext::getDWARFObj(this->DCtx);
  local_1c = 0;
  iVar2 = (*pDStack_18->_vptr_DWARFObject[9])();
  local_30.Data = (char *)CONCAT44(extraout_var,iVar2);
  bVar1 = StringRef::empty(&local_30);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    pDVar4 = DWARFContext::getDebugAbbrev(this->DCtx);
    uVar3 = verifyAbbrevSection(this,pDVar4);
    local_1c = uVar3 + local_1c;
  }
  iVar2 = (*pDStack_18->_vptr_DWARFObject[0x1c])();
  local_40.Data = (char *)CONCAT44(extraout_var_00,iVar2);
  bVar1 = StringRef::empty(&local_40);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    pDVar4 = DWARFContext::getDebugAbbrevDWO(this->DCtx);
    uVar3 = verifyAbbrevSection(this,pDVar4);
    local_1c = uVar3 + local_1c;
  }
  return local_1c == 0;
}

Assistant:

bool DWARFVerifier::handleDebugAbbrev() {
  OS << "Verifying .debug_abbrev...\n";

  const DWARFObject &DObj = DCtx.getDWARFObj();
  unsigned NumErrors = 0;
  if (!DObj.getAbbrevSection().empty())
    NumErrors += verifyAbbrevSection(DCtx.getDebugAbbrev());
  if (!DObj.getAbbrevDWOSection().empty())
    NumErrors += verifyAbbrevSection(DCtx.getDebugAbbrevDWO());

  return NumErrors == 0;
}